

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

parser_error parse_renderer_combine(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *name_00;
  char *name;
  renderer_info *renderer;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name_00 = parser_getstr(p,"combine");
    iVar1 = ui_entry_combiner_lookup(name_00);
    *(int *)((long)pvVar2 + 0x3c) = iVar1;
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
    if (*(int *)((long)pvVar2 + 0x3c) != 0) {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_renderer_combine(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *name;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "combine");
	renderer->combiner_index = ui_entry_combiner_lookup(name);
	return (renderer->combiner_index) ?
		PARSE_ERROR_NONE : PARSE_ERROR_INVALID_VALUE;
}